

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall BCLog::Logger::ShrinkDebugFile(Logger *this)

{
  long lVar1;
  string_view logging_function;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  ulong uVar5;
  size_type sVar6;
  char *pcVar7;
  size_t sVar8;
  long in_RDI;
  long in_FS_OFFSET;
  int nBytes;
  filesystem_error *anon_var_0;
  size_t log_size;
  FILE *file;
  size_t RECENT_DEBUG_HISTORY_SIZE;
  Level in_stack_000000b0;
  vector<char,_std::allocator<char>_> vch;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  allocator_type *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  size_type in_stack_ffffffffffffff30;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  ConstevalFormatString<0U> in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffd0 [15];
  undefined1 uVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::filesystem::__cxx11::path::empty
                    ((path *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_file_path.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                  ,0x1d8,"void BCLog::Logger::ShrinkDebugFile()");
  }
  pFVar4 = fsbridge::fopen((char *)(in_RDI + 0xd8),"r");
  uVar5 = std::filesystem::file_size((path *)(in_RDI + 0xd8));
  if ((pFVar4 == (FILE *)0x0) || (uVar5 < 0xa7d8c1)) {
    if (pFVar4 != (FILE *)0x0) {
      fclose(pFVar4);
    }
  }
  else {
    uVar9 = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (value_type *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffde);
    sVar6 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    iVar3 = fseek(pFVar4,-sVar6,2);
    if (iVar3 == 0) {
      pcVar7 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      sVar6 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      sVar8 = fread(pcVar7,1,sVar6,pFVar4);
      iVar3 = (int)sVar8;
      fclose(pFVar4);
      pFVar4 = fsbridge::fopen((char *)(in_RDI + 0xd8),"w");
      if (pFVar4 != (FILE *)0x0) {
        pcVar7 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        fwrite(pcVar7,1,(long)iVar3,pFVar4);
        fclose(pFVar4);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
      logging_function._M_str._7_1_ = uVar9;
      logging_function._0_15_ = in_stack_ffffffffffffffd0;
      LogPrintFormatInternal<>
                (logging_function,in_stack_ffffffffffffffc0,0,
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_000000b0,
                 in_stack_ffffffffffffffb8);
      fclose(pFVar4);
    }
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::ShrinkDebugFile()
{
    // Amount of debug.log to save at end when shrinking (must fit in memory)
    constexpr size_t RECENT_DEBUG_HISTORY_SIZE = 10 * 1000000;

    assert(!m_file_path.empty());

    // Scroll debug.log if it's getting too big
    FILE* file = fsbridge::fopen(m_file_path, "r");

    // Special files (e.g. device nodes) may not have a size.
    size_t log_size = 0;
    try {
        log_size = fs::file_size(m_file_path);
    } catch (const fs::filesystem_error&) {}

    // If debug.log file is more than 10% bigger the RECENT_DEBUG_HISTORY_SIZE
    // trim it down by saving only the last RECENT_DEBUG_HISTORY_SIZE bytes
    if (file && log_size > 11 * (RECENT_DEBUG_HISTORY_SIZE / 10))
    {
        // Restart the file with some of the end
        std::vector<char> vch(RECENT_DEBUG_HISTORY_SIZE, 0);
        if (fseek(file, -((long)vch.size()), SEEK_END)) {
            LogPrintf("Failed to shrink debug log file: fseek(...) failed\n");
            fclose(file);
            return;
        }
        int nBytes = fread(vch.data(), 1, vch.size(), file);
        fclose(file);

        file = fsbridge::fopen(m_file_path, "w");
        if (file)
        {
            fwrite(vch.data(), 1, nBytes, file);
            fclose(file);
        }
    }
    else if (file != nullptr)
        fclose(file);
}